

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateEnterInitializingMode(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    helics::Federate::enterInitializingMode(this);
  }
  return;
}

Assistant:

void helicsFederateEnterInitializingMode(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterInitializingMode();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}